

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void __thiscall player_t::TickPSprites(player_t *this)

{
  bool bVar1;
  AActor *pAVar2;
  AInventory *pAVar3;
  DPSprite *local_18;
  DPSprite *pspr;
  player_t *this_local;
  
  local_18 = ::TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&this->psprites);
  do {
    if (local_18 == (DPSprite *)0x0) {
      if ((0 < this->health) ||
         ((this->ReadyWeapon != (AWeapon *)0x0 &&
          ((*(uint *)&(this->ReadyWeapon->super_AInventory).field_0x4dc & 0x40000) == 0)))) {
        if (this->ReadyWeapon == (AWeapon *)0x0) {
          if (this->PendingWeapon != (AWeapon *)0xffffffffffffffff) {
            P_BringUpWeapon(this);
          }
        }
        else {
          P_CheckWeaponSwitch(this);
          if ((this->WeaponState & 5) != 0) {
            P_CheckWeaponFire(this);
          }
          P_CheckWeaponButtons(this);
        }
      }
      return;
    }
    bVar1 = TObjPtr<AActor>::operator==(&local_18->Caller,(AActor *)0x0);
    if (bVar1) {
LAB_006a618f:
      (*(local_18->super_DObject)._vptr_DObject[4])();
    }
    else {
      pAVar2 = TObjPtr<AActor>::operator->(&local_18->Caller);
      bVar1 = DObject::IsKindOf((DObject *)pAVar2,AInventory::RegistrationInfo.MyClass);
      if (bVar1) {
        pAVar3 = barrier_cast<AInventory*,AActor>(&local_18->Caller);
        bVar1 = TObjPtr<AActor>::operator!=(&pAVar3->Owner,&local_18->Owner->mo->super_AActor);
        if (bVar1) goto LAB_006a618f;
      }
      pAVar2 = TObjPtr<AActor>::operator->(&local_18->Caller);
      bVar1 = DObject::IsKindOf((DObject *)pAVar2,AWeapon::RegistrationInfo.MyClass);
      if ((bVar1) &&
         (bVar1 = TObjPtr<AActor>::operator!=
                            (&local_18->Caller,(AActor *)local_18->Owner->ReadyWeapon), bVar1))
      goto LAB_006a618f;
      DPSprite::Tick(local_18);
    }
    local_18 = ::TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&local_18->Next);
  } while( true );
}

Assistant:

void player_t::TickPSprites()
{
	DPSprite *pspr = psprites;
	while (pspr)
	{
		// Destroy the psprite if it's from a weapon that isn't currently selected by the player
		// or if it's from an inventory item that the player no longer owns. 
		if ((pspr->Caller == nullptr ||
			(pspr->Caller->IsKindOf(RUNTIME_CLASS(AInventory)) && barrier_cast<AInventory *>(pspr->Caller)->Owner != pspr->Owner->mo) ||
			(pspr->Caller->IsKindOf(RUNTIME_CLASS(AWeapon)) && pspr->Caller != pspr->Owner->ReadyWeapon)))
		{
			pspr->Destroy();
		}
		else
		{
			pspr->Tick();
		}

		pspr = pspr->Next;
	}

	if ((health > 0) || (ReadyWeapon != nullptr && !(ReadyWeapon->WeaponFlags & WIF_NODEATHINPUT)))
	{
		if (ReadyWeapon == nullptr)
		{
			if (PendingWeapon != WP_NOCHANGE)
				P_BringUpWeapon(this);
		}
		else
		{
			P_CheckWeaponSwitch(this);
			if (WeaponState & (WF_WEAPONREADY | WF_WEAPONREADYALT))
			{
				P_CheckWeaponFire(this);
			}
			// Check custom buttons
			P_CheckWeaponButtons(this);
		}
	}
}